

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::LayerToStage(Layer *layer,Stage *stage_out,string *warn,string *err)

{
  bool bVar1;
  LayerMetas *pLVar2;
  StageMetas *this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *this_00;
  value_type *prim;
  optional<tinyusdz::Prim> local_1d68;
  undefined1 local_1a10 [8];
  optional<tinyusdz::Prim> pv;
  value_type *primspec;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range1;
  Stage stage;
  string *err_local;
  string *warn_local;
  Stage *stage_out_local;
  Layer *layer_local;
  
  stage._prim_id_allocator._32_8_ = err;
  if (stage_out == (Stage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`stage_ptr` is nullptr.");
    }
    layer_local._7_1_ = false;
  }
  else {
    Stage::Stage((Stage *)&__range1);
    pLVar2 = Layer::metas(layer);
    this = Stage::metas((Stage *)&__range1);
    LayerMetas::operator=(this,pLVar2);
    this_00 = Layer::primspecs_abi_cxx11_(layer);
    __end1 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
             ::begin(this_00);
    primspec = (value_type *)
               ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
               ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&__end1,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&primspec), bVar1) {
      pv.contained._840_8_ =
           ::std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
           ::operator*(&__end1);
      detail::ReconstructPrimFromPrimSpec
                (&local_1d68,&((reference)pv.contained._840_8_)->second,warn,
                 (string *)stage._prim_id_allocator._32_8_);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                ((optional<tinyusdz::Prim> *)local_1a10,&local_1d68);
      nonstd::optional_lite::optional<tinyusdz::Prim>::~optional(&local_1d68);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1a10);
      if (bVar1) {
        prim = nonstd::optional_lite::optional<tinyusdz::Prim>::value
                         ((optional<tinyusdz::Prim> *)local_1a10);
        Stage::add_root_prim((Stage *)&__range1,prim,true);
      }
      nonstd::optional_lite::optional<tinyusdz::Prim>::~optional
                ((optional<tinyusdz::Prim> *)local_1a10);
      ::std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
      ::operator++(&__end1);
    }
    Stage::operator=(stage_out,(Stage *)&__range1);
    layer_local._7_1_ = true;
    Stage::~Stage((Stage *)&__range1);
  }
  return layer_local._7_1_;
}

Assistant:

bool LayerToStage(const Layer &layer, Stage *stage_out, std::string *warn,
                  std::string *err) {
  if (!stage_out) {
    if (err) {
      (*err) += "`stage_ptr` is nullptr.";
    }
    return false;
  }

  Stage stage;

  stage.metas() = layer.metas();

  // TODO: primChildren metadatum
  for (const auto &primspec : layer.primspecs()) {
    if (auto pv =
            detail::ReconstructPrimFromPrimSpec(primspec.second, warn, err)) {
      stage.add_root_prim(std::move(pv.value()));
    }
  }

  (*stage_out) = stage;

  return true;
}